

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

rotation_t *
opengv::relative_pose::ge
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices,
          geOutput_t *output,bool useWeights)

{
  double dVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar45;
  Index *pIVar46;
  double *pdVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  int iVar52;
  size_t i_1;
  int iVar53;
  size_t i;
  size_t sVar54;
  ulong uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  double dVar63;
  double dVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double dVar69;
  double dVar70;
  undefined1 auVar71 [16];
  double dVar73;
  double dVar74;
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double dVar80;
  undefined1 in_ZMM3 [64];
  undefined1 auVar81 [16];
  double dVar82;
  undefined1 auVar83 [16];
  double dVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  double dVar87;
  sub local_13c2;
  false_type local_13c1;
  double local_13c0;
  rotation_t startingRotation;
  double dStack_1370;
  double local_1368;
  double dStack_1360;
  double dStack_1358;
  double dStack_1350;
  double dStack_1348;
  double dStack_1340;
  double dStack_1338;
  double dStack_1330;
  double local_1328;
  double dStack_1320;
  double dStack_1318;
  double dStack_1310;
  double dStack_1308;
  double dStack_1300;
  double dStack_12f8;
  double dStack_12f0;
  double local_12e8;
  double dStack_12e0;
  double local_12d8;
  double dStack_12d0;
  double local_12c8;
  double dStack_12c0;
  double local_12b8;
  double dStack_12b0;
  double dStack_12a8;
  double dStack_12a0;
  double dStack_1298;
  double dStack_1290;
  double dStack_1288;
  double dStack_1280;
  double local_1278;
  double dStack_1270;
  double dStack_1268;
  double dStack_1260;
  double dStack_1258;
  double dStack_1250;
  double dStack_1248;
  double dStack_1240;
  double local_1238;
  double dStack_1230;
  double dStack_1228;
  double dStack_1220;
  double local_1218;
  double dStack_1210;
  double local_1208;
  double dStack_1200;
  double local_11f8;
  double dStack_11f0;
  double local_11e8;
  double dStack_11e0;
  double local_11d8;
  double dStack_11d0;
  double local_11c8;
  double dStack_11c0;
  double local_11b8;
  double dStack_11b0;
  double local_11a8;
  double dStack_11a0;
  double local_1198;
  double dStack_1190;
  double local_1188;
  double dStack_1180;
  double local_1178;
  double dStack_1170;
  double local_1168;
  double dStack_1160;
  double local_1158;
  double dStack_1150;
  double local_1148;
  double dStack_1140;
  double local_1138;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  MatrixXd Hcross;
  double dStack_10f0;
  double local_10e8;
  double dStack_10e0;
  double local_10d8;
  double dStack_10d0;
  double local_10c8;
  undefined1 local_10b0 [16];
  scalar_constant_op<double> local_10a0;
  RhsNested local_1098;
  Matrix<double,_1,_9,_1,_1,_9> *local_1088;
  double local_1078;
  undefined8 uStack_1070;
  undefined1 local_1068 [16];
  bearingVector_t f2;
  Matrix<double,_1,_9,_1,_1,_9> f1_19;
  Matrix<double,_9,_9,_0,_9,_9> m22P;
  Matrix<double,_9,_9,_0,_9,_9> m12P;
  Matrix<double,_9,_9,_0,_9,_9> m11P;
  Matrix<double,_3,_9,_0,_3,_9> z2P;
  Matrix<double,_3,_9,_0,_3,_9> y2P;
  Matrix<double,_3,_9,_0,_3,_9> x2P;
  Matrix<double,_3,_9,_0,_3,_9> z1P;
  Matrix<double,_3,_9,_0,_3,_9> y1P;
  Matrix<double,_1,_9,_1,_1,_9> f2_19;
  Matrix3d zxF;
  Matrix3d yzF;
  Matrix3d xyF;
  Matrix3d zzF;
  Matrix3d yyF;
  Matrix3d xxF;
  Vector3d t2;
  Vector3d t1;
  double local_148;
  Matrix<double,_3,_9,_0,_3,_9> x1P;
  
  sVar3 = indices->_numberCorrespondences;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       0.0;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[9] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[10] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xb] = 0.0
  ;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xc] = 0.0
  ;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xd] = 0.0
  ;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xe] = 0.0
  ;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xf] = 0.0
  ;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[9] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[10] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xb] = 0.0
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xc] = 0.0
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xd] = 0.0
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xe] = 0.0
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xf] = 0.0
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] = 0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[9] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[10] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xb] = 0.0
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xc] = 0.0
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xd] = 0.0
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xe] = 0.0
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xf] = 0.0
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] = 0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[9] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[10] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xb] = 0.0
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xc] = 0.0
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xd] = 0.0
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xe] = 0.0
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xf] = 0.0
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] = 0.0;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[9] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[10] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xb] = 0.0
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xc] = 0.0
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xd] = 0.0
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xe] = 0.0
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xf] = 0.0
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] = 0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[9] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[10] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xb] = 0.0
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xc] = 0.0
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xd] = 0.0
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xe] = 0.0
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xf] = 0.0
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] = 0.0;
  auVar56 = in_ZMM3._0_16_;
  memset(&m11P,0,0x288);
  memset(&m12P,0,0x288);
  memset(&m22P,0,0x288);
  dVar63 = 0.0;
  if (sVar3 == 0) {
    local_13c0 = 0.0;
    local_1128 = ZEXT816(0);
    local_148 = 0.0;
    local_1118 = ZEXT816(0);
  }
  else {
    lVar50 = 0;
    sVar54 = 0;
    do {
      if (indices->_useIndices == false) {
        iVar53 = (int)sVar54;
      }
      else {
        iVar53 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar50 >> 0x1e));
      }
      local_13c0 = dVar63;
      (*adapter->_vptr_RelativeAdapterBase[4])(adapter,(long)iVar53);
      sVar54 = sVar54 + 1;
      lVar50 = lVar50 + 0x100000000;
      dVar63 = local_13c0 + dVar63 * dVar63;
    } while (sVar3 != sVar54);
    if (dVar63 < 0.0) {
      dVar63 = sqrt(dVar63);
    }
    else {
      auVar56._8_8_ = 0;
      auVar56._0_8_ = dVar63;
      auVar56 = vsqrtsd_avx(auVar56,auVar56);
      dVar63 = auVar56._0_8_;
    }
    sVar54 = 0;
    do {
      dVar70 = 1.0;
      local_13c0 = 1.0;
      iVar53 = (int)sVar54;
      if (useWeights) {
        iVar52 = iVar53;
        if (indices->_useIndices == true) {
          iVar52 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar53];
        }
        (*adapter->_vptr_RelativeAdapterBase[4])(adapter,(long)iVar52);
        local_13c0 = dVar70 / dVar63;
      }
      iVar52 = iVar53;
      if (indices->_useIndices == true) {
        iVar52 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      (*adapter->_vptr_RelativeAdapterBase[6])
                ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,adapter,(long)iVar52);
      iVar52 = iVar53;
      if (indices->_useIndices == true) {
        iVar52 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&Hcross,adapter,(long)iVar52);
      auVar12._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar12._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      auVar29._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar29._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar57._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar57._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar56 = vmulpd_avx512vl(auVar12,auVar57);
      auVar58._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      auVar58._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      auVar56 = vfmadd132pd_avx512vl(auVar29,auVar56,auVar58);
      auVar65._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      auVar65._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      auVar35._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar35._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      auVar56 = vfmadd231pd_fma(auVar56,auVar65,auVar35);
      local_1078 = (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols *
                   startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[8];
      local_1128._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2] *
           (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                   .m_data;
      local_1068._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[5] *
           (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                   .m_rows;
      iVar52 = iVar53;
      if (indices->_useIndices == true) {
        iVar52 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      (*adapter->_vptr_RelativeAdapterBase[8])
                ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,adapter,(long)iVar52);
      iVar52 = iVar53;
      if (indices->_useIndices == true) {
        iVar52 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      local_1128._0_8_ = local_1078 + (double)local_1068._0_8_ + (double)local_1128._0_8_;
      local_1128._8_8_ = 0;
      (*adapter->_vptr_RelativeAdapterBase[3])(&Hcross,adapter,(long)iVar52);
      auVar24._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar24._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      pIVar46 = &Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols;
      lVar50 = 0;
      auVar13._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar13._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar57 = vmulpd_avx512vl(auVar24,auVar13);
      auVar30._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar30._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar14._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      auVar14._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      auVar57 = vfmadd132pd_avx512vl(auVar30,auVar57,auVar14);
      auVar71._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      auVar71._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      auVar36._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar36._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      auVar57 = vfmadd231pd_fma(auVar57,auVar71,auVar36);
      f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           auVar57._0_8_;
      dVar74 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[0];
      f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
           auVar57._8_8_;
      dVar11 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[1];
      dVar70 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2] *
               (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data +
               startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5] *
               (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows +
               (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols *
               startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
      f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           dVar70;
      do {
        dVar87 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[lVar50];
        lVar50 = lVar50 + 1;
        ((DenseStorage<double,__1,__1,__1,_0> *)(pIVar46 + -2))->m_data =
             (double *)(dVar74 * dVar87);
        pIVar46[-1] = (Index)(dVar11 * dVar87);
        *pIVar46 = (Index)(dVar70 * dVar87);
        pIVar46 = pIVar46 + 3;
      } while (lVar50 != 3);
      dVar69 = auVar56._0_8_;
      dVar70 = local_13c0 * dVar69;
      local_1068 = vshufpd_avx(auVar56,auVar56,1);
      dVar87 = local_1068._0_8_;
      dVar74 = local_13c0 * dVar87;
      local_1078 = local_13c0 * (double)local_1128._0_8_;
      dVar11 = dVar69 * dVar70;
      uStack_1070 = 0;
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar11 * dStack_10f0 +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar11 * local_10e8 +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar11 * dStack_10e0 +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar11 * local_10d8 +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar11 * dStack_10d0 +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           local_10c8 * dVar11 +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      dVar11 = dVar87 * dVar74;
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar11 * dStack_10f0 +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar11 * local_10e8 +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar11 * dStack_10e0 +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar11 * local_10d8 +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar11 * dStack_10d0 +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           local_10c8 * dVar11 +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      dVar11 = (double)local_1128._0_8_ * local_1078;
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar11 * dStack_10f0 +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar11 * local_10e8 +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar11 * dStack_10e0 +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar11 * local_10d8 +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar11 * dStack_10d0 +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           local_10c8 * dVar11 +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      dVar87 = dVar87 * dVar70;
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar87 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar87 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar87 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar87 * dStack_10f0 +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar87 * local_10e8 +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar87 * dStack_10e0 +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar87 * local_10d8 +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar87 * dStack_10d0 +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           local_10c8 * dVar87 +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      dVar11 = dVar74 * (double)local_1128._0_8_;
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar11 * dStack_10f0 +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar11 * local_10e8 +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar11 * dStack_10e0 +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar11 * local_10d8 +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar11 * dStack_10d0 +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           local_10c8 * dVar11 +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      dVar11 = dVar69 * local_1078;
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar11 * (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar11 * dStack_10f0 +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar11 * local_10e8 +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar11 * dStack_10e0 +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar11 * local_10d8 +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar11 * dStack_10d0 +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           local_10c8 * dVar11 +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      iVar52 = iVar53;
      if (indices->_useIndices == true) {
        iVar52 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      (*adapter->_vptr_RelativeAdapterBase[5])(&t1,adapter,(long)iVar52);
      if (indices->_useIndices == true) {
        iVar53 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      (*adapter->_vptr_RelativeAdapterBase[7])(&t2,adapter,(long)iVar53);
      dVar87 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[1];
      dVar11 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[0];
      auVar44._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar44._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar81._8_8_ = 0;
      auVar81._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar85._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar85._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      uVar45 = local_1068._0_8_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[2];
      auVar59 = vbroadcastsd_avx512f(auVar2);
      auVar41._8_8_ =
           f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar41._0_8_ =
           f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar60 = vbroadcastsd_avx512f(local_1128);
      auVar58 = vunpcklpd_avx(auVar85,auVar81);
      auVar12 = vunpcklpd_avx(auVar60._0_16_,auVar56);
      auVar57 = vshufpd_avx(auVar56,auVar60._0_16_,1);
      auVar75._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
           * auVar12._0_8_;
      auVar75._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           * auVar12._8_8_;
      auVar57 = vfmsub213pd_fma(auVar58,auVar57,auVar75);
      auVar43._8_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar43._0_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar76._8_8_ = 0;
      auVar76._0_8_ =
           (double)local_1068._0_8_ *
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar58 = vfmsub231sd_fma(auVar76,auVar56,auVar44);
      vinsertf32x4_avx512f(ZEXT1664(auVar57),auVar57,1);
      auVar57 = vunpcklpd_avx(auVar59._0_16_,auVar41);
      auVar61 = vbroadcastsd_avx512f(auVar58);
      dVar64 = auVar59._0_8_;
      auVar61 = vpermt2pd_avx512f(_DAT_00251680,auVar61);
      auVar83._8_8_ = 0;
      auVar83._0_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar86._8_8_ = 0;
      auVar86._0_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1];
      auVar12 = vfmsub231sd_fma(auVar86,auVar41,auVar43);
      auVar59 = vpermt2pd_avx512f(_DAT_002516c0,auVar59);
      auVar59 = vmulpd_avx512f(auVar61,auVar59);
      auVar61 = vbroadcastsd_avx512f(auVar12);
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
           (double)auVar59._0_8_;
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1] =
           (double)auVar59._8_8_;
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
           (double)auVar59._16_8_;
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
           (double)auVar59._24_8_;
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4] =
           (double)auVar59._32_8_;
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
           (double)auVar59._40_8_;
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[6] =
           (double)auVar59._48_8_;
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[7] =
           (double)auVar59._56_8_;
      auVar79._8_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar79._0_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[8] =
           dVar64 * auVar58._0_8_;
      auVar77._0_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
           * auVar57._0_8_;
      auVar77._8_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           * auVar57._8_8_;
      auVar57 = vunpcklpd_avx(auVar79,auVar83);
      auVar42._8_8_ =
           f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar42._0_8_ =
           f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar57 = vfmsub132pd_fma(auVar57,auVar77,auVar42);
      auVar59 = vpermt2pd_avx512f(_DAT_002516c0,auVar60);
      vinsertf32x4_avx512f(ZEXT1664(auVar57),auVar57,1);
      auVar60 = vpermt2pd_avx512f(_DAT_00251680,auVar61);
      auVar59 = vmulpd_avx512f(auVar59,auVar60);
      f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
           (double)auVar59._0_8_;
      f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1] =
           (double)auVar59._8_8_;
      f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
           (double)auVar59._16_8_;
      f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
           (double)auVar59._24_8_;
      f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4] =
           (double)auVar59._32_8_;
      f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
           (double)auVar59._40_8_;
      f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[6] =
           (double)auVar59._48_8_;
      f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[7] =
           (double)auVar59._56_8_;
      f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[8] =
           (double)local_1128._0_8_ * auVar12._0_8_;
      if (useWeights) {
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        dVar69 = dVar70 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0];
        dVar73 = dVar70 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1];
        do {
          dVar80 = f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                   m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar82 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               dVar69 * dVar80 + ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0];
          pdVar47[-1] = dVar73 * dVar80 + dVar82;
          *pdVar47 = dVar70 * dVar64 * dVar80 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        do {
          dVar80 = f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                   m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar82 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               dVar74 * dVar11 * dVar80 + ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0]
          ;
          pdVar47[-1] = dVar74 * dVar87 * dVar80 + dVar82;
          *pdVar47 = dVar74 * dVar64 * dVar80 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        dVar80 = local_1078 * dVar64;
        dVar82 = local_1078 * dVar11;
        dVar84 = local_1078 * dVar87;
        do {
          dVar1 = f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                  m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar23 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               dVar82 * dVar1 + ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0];
          pdVar47[-1] = dVar84 * dVar1 + dVar23;
          *pdVar47 = dVar80 * dVar1 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        do {
          dVar1 = f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                  m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar23 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               dVar69 * dVar1 + ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0];
          pdVar47[-1] = dVar73 * dVar1 + dVar23;
          *pdVar47 = dVar70 * dVar64 * dVar1 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        do {
          dVar70 = f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                   m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar69 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               dVar74 * dVar11 * dVar70 + ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0]
          ;
          pdVar47[-1] = dVar74 * dVar87 * dVar70 + dVar69;
          *pdVar47 = dVar74 * dVar64 * dVar70 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        do {
          dVar70 = f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                   m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar74 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               dVar82 * dVar70 + ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0];
          pdVar47[-1] = dVar84 * dVar70 + dVar74;
          *pdVar47 = dVar80 * dVar70 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        local_1098.m_matrix = &f1_19;
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        local_10a0.m_other = local_13c0;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        local_1088 = local_1098.m_matrix;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
                    *)local_10b0,local_1098.m_matrix,&local_13c2,&local_13c1);
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[0];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[1];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[3];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[4]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[4];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[6]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[6];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[7]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[7];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[8]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
        local_10a0.m_other = local_13c0;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        local_1098.m_matrix = &f2_19;
        local_1088 = &f2_19;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
                    *)local_10b0,&f2_19,&local_13c2,&local_13c1);
        local_1088 = &f1_19;
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[0];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[1];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[3];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[4]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[4];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[6]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[6];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[7]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[7];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[8]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
        local_10a0.m_other = local_13c0;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        dStack_1370 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[9];
        local_1368 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[10];
        dStack_1360 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xb];
        dStack_1358 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xc];
        dStack_1350 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xd];
        dStack_1348 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xe];
        dStack_1340 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xf];
        dStack_1338 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x10];
        dStack_1330 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x11];
        local_1328 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x12];
        dStack_1320 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x13];
        dStack_1318 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x14];
        dStack_1310 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x15];
        dStack_1308 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x16];
        dStack_1300 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x17];
        dStack_12f8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x18];
        dStack_12f0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x19];
        local_12e8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1a];
        dStack_12e0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1b];
        local_12d8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1c];
        dStack_12d0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1d];
        local_12c8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1e];
        dStack_12c0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1f];
        local_12b8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x20];
        dStack_12b0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x21];
        dStack_12a8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x22];
        dStack_12a0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x23];
        dStack_1298 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x24];
        dStack_1290 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x25];
        dStack_1288 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x26];
        dStack_1280 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x27];
        local_1278 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x28];
        dStack_1270 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x29];
        dStack_1268 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2a];
        dStack_1260 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2b];
        dStack_1258 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2c];
        dStack_1250 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2d];
        dStack_1248 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2e];
        dStack_1240 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2f];
        local_1238 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x30];
        dStack_1230 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x31];
        dStack_1228 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x32];
        dStack_1220 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x33];
        local_1218 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x34];
        dStack_1210 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x35];
        local_1208 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x36];
        dStack_1200 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x37];
        local_11f8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x38];
        dStack_11f0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x39];
        local_11e8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3a];
        dStack_11e0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3b];
        local_11d8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3c];
        dStack_11d0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3d];
        local_11c8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3e];
        dStack_11c0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3f];
        local_11b8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x40];
        dStack_11b0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x41];
        local_11a8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x42];
        dStack_11a0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x43];
        local_1198 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x44];
        dStack_1190 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x45];
        local_1188 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x46];
        dStack_1180 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x47];
        local_1178 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x48];
        dStack_1170 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x49];
        local_1168 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4a];
        dStack_1160 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4b];
        local_1158 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4c];
        dStack_1150 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4d];
        local_1148 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4e];
        dStack_1140 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4f];
        local_1138 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x50];
        local_1098.m_matrix = &f2_19;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
                    *)local_10b0,local_1088,&local_13c2,&local_13c1);
      }
      else {
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        dVar70 = dVar69 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0];
        dVar74 = dVar69 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1];
        do {
          dVar73 = f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                   m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar80 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               dVar70 * dVar73 + ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0];
          pdVar47[-1] = dVar74 * dVar73 + dVar80;
          *pdVar47 = dVar69 * dVar64 * dVar73 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        auVar56 = vshufpd_avx(auVar56,auVar56,3);
        dVar73 = auVar56._0_8_ * dVar11;
        dVar80 = auVar56._8_8_ * dVar87;
        do {
          dVar82 = f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                   m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar84 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               dVar73 * dVar82 + ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0];
          pdVar47[-1] = dVar80 * dVar82 + dVar84;
          *pdVar47 = (double)uVar45 * dVar64 * dVar82 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        do {
          dVar82 = f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                   m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar84 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               (double)local_1128._0_8_ * dVar11 * dVar82 +
               ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0];
          pdVar47[-1] = (double)local_1128._0_8_ * dVar87 * dVar82 + dVar84;
          *pdVar47 = (double)local_1128._0_8_ * dVar64 * dVar82 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        do {
          dVar82 = f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                   m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar84 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               dVar70 * dVar82 + ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0];
          pdVar47[-1] = dVar74 * dVar82 + dVar84;
          *pdVar47 = dVar69 * dVar64 * dVar82 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        do {
          dVar70 = f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                   m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar74 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               dVar73 * dVar70 + ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0];
          pdVar47[-1] = dVar80 * dVar70 + dVar74;
          *pdVar47 = (double)uVar45 * dVar64 * dVar70 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar50 = 0;
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        do {
          dVar70 = f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                   m_data.array[lVar50];
          lVar50 = lVar50 + 1;
          dVar74 = pdVar47[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] =
               (double)local_1128._0_8_ * dVar11 * dVar70 +
               ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0];
          pdVar47[-1] = (double)local_1128._0_8_ * dVar87 * dVar70 + dVar74;
          *pdVar47 = (double)local_1128._0_8_ * dVar64 * dVar70 + *pdVar47;
          pdVar47 = pdVar47 + 3;
        } while (lVar50 != 9);
        local_10b0._0_8_ = &f1_19;
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        local_10b0._8_8_ = local_10b0._0_8_;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)local_10b0,
                   (Matrix<double,_1,_9,_1,_1,_9> *)local_10b0._0_8_,(sub *)&local_13c2,&local_13c1)
        ;
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[0];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[1];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[3];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[4]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[4];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[6]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[6];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[7]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[7];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[8]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        local_10b0._0_8_ = &f2_19;
        local_10b0._8_8_ = &f2_19;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)local_10b0,&f2_19,
                   (sub *)&local_13c2,&local_13c1);
        local_10b0._8_8_ = &f1_19;
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[0];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[1];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[3];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[4]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[4];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[6]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[6];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[7]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[7];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[8]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        dStack_1370 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[9];
        local_1368 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[10];
        dStack_1360 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xb];
        dStack_1358 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xc];
        dStack_1350 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xd];
        dStack_1348 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xe];
        dStack_1340 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xf];
        dStack_1338 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x10];
        dStack_1330 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x11];
        local_1328 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x12];
        dStack_1320 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x13];
        dStack_1318 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x14];
        dStack_1310 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x15];
        dStack_1308 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x16];
        dStack_1300 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x17];
        dStack_12f8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x18];
        dStack_12f0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x19];
        local_12e8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1a];
        dStack_12e0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1b];
        local_12d8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1c];
        dStack_12d0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1d];
        local_12c8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1e];
        dStack_12c0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1f];
        local_12b8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x20];
        dStack_12b0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x21];
        dStack_12a8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x22];
        dStack_12a0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x23];
        dStack_1298 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x24];
        dStack_1290 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x25];
        dStack_1288 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x26];
        dStack_1280 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x27];
        local_1278 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x28];
        dStack_1270 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x29];
        dStack_1268 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2a];
        dStack_1260 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2b];
        dStack_1258 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2c];
        dStack_1250 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2d];
        dStack_1248 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2e];
        dStack_1240 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2f];
        local_1238 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x30];
        dStack_1230 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x31];
        dStack_1228 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x32];
        dStack_1220 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x33];
        local_1218 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x34];
        dStack_1210 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x35];
        local_1208 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x36];
        dStack_1200 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x37];
        local_11f8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x38];
        dStack_11f0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x39];
        local_11e8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3a];
        dStack_11e0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3b];
        local_11d8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3c];
        dStack_11d0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3d];
        local_11c8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3e];
        dStack_11c0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3f];
        local_11b8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x40];
        dStack_11b0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x41];
        local_11a8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x42];
        dStack_11a0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x43];
        local_1198 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x44];
        dStack_1190 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x45];
        local_1188 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x46];
        dStack_1180 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x47];
        local_1178 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x48];
        dStack_1170 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x49];
        local_1168 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4a];
        dStack_1160 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4b];
        local_1158 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4c];
        dStack_1150 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4d];
        local_1148 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4e];
        dStack_1140 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4f];
        local_1138 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x50];
        local_10b0._0_8_ = &f2_19;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)local_10b0,
                   (Matrix<double,_1,_9,_1,_1,_9> *)local_10b0._8_8_,(sub *)&local_13c2,&local_13c1)
        ;
      }
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[4] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[5];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[6] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[7] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[8] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[8];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[9] =
           dStack_1370;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[10] =
           local_1368;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0xb]
           = dStack_1360;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0xc]
           = dStack_1358;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0xd]
           = dStack_1350;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0xe]
           = dStack_1348;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0xf]
           = dStack_1340;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x10]
           = dStack_1338;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x11]
           = dStack_1330;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x12]
           = local_1328;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x13]
           = dStack_1320;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x14]
           = dStack_1318;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x15]
           = dStack_1310;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x16]
           = dStack_1308;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x17]
           = dStack_1300;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x18]
           = dStack_12f8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x19]
           = dStack_12f0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1a]
           = local_12e8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1b]
           = dStack_12e0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1c]
           = local_12d8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1d]
           = dStack_12d0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1e]
           = local_12c8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1f]
           = dStack_12c0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x20]
           = local_12b8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x21]
           = dStack_12b0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x22]
           = dStack_12a8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x23]
           = dStack_12a0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x24]
           = dStack_1298;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x25]
           = dStack_1290;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x26]
           = dStack_1288;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x27]
           = dStack_1280;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x29]
           = dStack_1270;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x28]
           = local_1278;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2a]
           = dStack_1268;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2b]
           = dStack_1260;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2c]
           = dStack_1258;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2d]
           = dStack_1250;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2e]
           = dStack_1248;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2f]
           = dStack_1240;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x30]
           = local_1238;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x31]
           = dStack_1230;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x32]
           = dStack_1228;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x33]
           = dStack_1220;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x36]
           = local_1208;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x37]
           = dStack_1200;
      sVar54 = sVar54 + 1;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x34]
           = local_1218;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x35]
           = dStack_1210;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3a]
           = local_11e8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3b]
           = dStack_11e0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3d]
           = dStack_11d0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3c]
           = local_11d8;
      auVar59 = ZEXT1664((undefined1  [16])
                         m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage
                         .m_data.array._480_16_);
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x38]
           = local_11f8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x39]
           = dStack_11f0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3e]
           = local_11c8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3f]
           = dStack_11c0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x40]
           = local_11b8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x41]
           = dStack_11b0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x42]
           = local_11a8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x43]
           = dStack_11a0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x44]
           = local_1198;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x45]
           = dStack_1190;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x46]
           = local_1188;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x47]
           = dStack_1180;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x48]
           = local_1178;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x49]
           = dStack_1170;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4a]
           = local_1168;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4b]
           = dStack_1160;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4c]
           = local_1158;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4d]
           = dStack_1150;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4e]
           = local_1148;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4f]
           = dStack_1140;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x50]
           = local_1138;
    } while (sVar54 != sVar3);
    lVar50 = 0;
    sVar54 = 0;
    local_1128 = ZEXT816(0);
    local_13c0 = 0.0;
    local_148 = 0.0;
    local_1118 = ZEXT816(0);
    do {
      iVar53 = (int)sVar54;
      lVar49 = lVar50 >> 0x1e;
      iVar52 = iVar53;
      if (indices->_useIndices != false) {
        iVar52 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar49);
      }
      auVar59 = ZEXT1664(auVar59._0_16_);
      (*adapter->_vptr_RelativeAdapterBase[6])(&startingRotation,adapter,(long)iVar52);
      iVar52 = iVar53;
      if (indices->_useIndices != false) {
        iVar52 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar49);
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&Hcross,adapter,(long)iVar52);
      auVar25._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar25._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      auVar31._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar31._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar15._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar15._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar56 = vmulpd_avx512vl(auVar25,auVar15);
      dVar63 = (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows *
               startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5];
      auVar16._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      auVar16._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      auVar56 = vfmadd132pd_avx512vl(auVar31,auVar56,auVar16);
      auVar66._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      auVar66._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      auVar37._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar37._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      local_1068 = vfmadd231pd_fma(auVar56,auVar66,auVar37);
      dVar70 = (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols *
               startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
      local_1078 = (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data *
                   startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[2];
      iVar52 = iVar53;
      if (indices->_useIndices != false) {
        iVar52 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar49);
      }
      (*adapter->_vptr_RelativeAdapterBase[8])(&startingRotation,adapter,(long)iVar52);
      if (indices->_useIndices != false) {
        iVar53 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar49);
      }
      local_148 = dVar70 + dVar63 + local_1078 + local_148;
      local_1118._8_8_ = (double)local_1118._8_8_ + (double)local_1068._8_8_;
      local_1118._0_8_ = (double)local_1118._0_8_ + (double)local_1068._0_8_;
      (*adapter->_vptr_RelativeAdapterBase[3])(&Hcross,adapter,(long)iVar53);
      auVar56 = auVar59._0_16_;
      auVar26._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar26._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      auVar32._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar32._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      sVar54 = sVar54 + 1;
      auVar17._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar17._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar57 = vmulpd_avx512vl(auVar26,auVar17);
      lVar50 = lVar50 + 0x100000000;
      auVar18._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      auVar18._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      auVar57 = vfmadd132pd_avx512vl(auVar32,auVar57,auVar18);
      auVar67._8_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      auVar67._0_8_ =
           Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      auVar38._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar38._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      auVar57 = vfmadd231pd_fma(auVar57,auVar67,auVar38);
      local_1128._8_8_ = auVar57._8_8_ + (double)local_1128._8_8_;
      local_1128._0_8_ = auVar57._0_8_ + (double)local_1128._0_8_;
      local_13c0 = (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data *
                   startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[2] +
                   (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows *
                   startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[5] +
                   (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols *
                   startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[8] + local_13c0;
    } while (sVar3 != sVar54);
  }
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&Hcross,9,3,3);
  if ((Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows == 3
      ) && (Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
            == 3)) {
    uVar51 = 9;
    uVar55 = 8;
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&Hcross,9,3,3);
    uVar51 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols * Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows;
    uVar55 = uVar51 + 7;
    if (-1 < (long)uVar51) {
      uVar55 = uVar51;
    }
    uVar55 = uVar55 & 0xfffffffffffffff8;
    pdVar47 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data;
    if ((long)uVar51 < 8) goto LAB_001365ec;
  }
  pdVar47 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
  ;
  uVar48 = 8;
  if (8 < (long)uVar55) {
    uVar48 = uVar55;
  }
  memset(Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data,0,
         uVar48 * 8);
LAB_001365ec:
  if (uVar51 - uVar55 != 0 && (long)uVar55 <= (long)uVar51) {
    memset(pdVar47 + uVar55,0,(uVar51 - uVar55) * 8);
  }
  if (sVar3 != 0) {
    auVar56 = vcvtusi2sd_avx512f(auVar56,sVar3);
    sVar54 = 0;
    dVar63 = auVar56._0_8_;
    auVar72._8_8_ = dVar63;
    auVar72._0_8_ = dVar63;
    auVar56 = vdivpd_avx(local_1118,auVar72);
    auVar57 = vdivpd_avx(local_1128,auVar72);
    local_13c0 = local_13c0 / dVar63;
    do {
      iVar52 = (int)sVar54;
      iVar53 = iVar52;
      if (indices->_useIndices == true) {
        iVar53 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar52];
      }
      (*adapter->_vptr_RelativeAdapterBase[6])(&startingRotation,adapter,(long)iVar53);
      iVar53 = iVar52;
      if (indices->_useIndices == true) {
        iVar53 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar52];
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&f1_19,adapter,(long)iVar53);
      auVar27._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar27._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      auVar33._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar33._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar19._8_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [0];
      auVar19._0_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [0];
      auVar58 = vmulpd_avx512vl(auVar27,auVar19);
      auVar20._8_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [1];
      auVar20._0_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [1];
      auVar58 = vfmadd132pd_avx512vl(auVar33,auVar58,auVar20);
      auVar68._8_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [2];
      auVar68._0_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [2];
      auVar39._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar39._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      auVar58 = vfmadd231pd_fma(auVar58,auVar68,auVar39);
      auVar58 = vsubpd_avx(auVar58,auVar56);
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
           (startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[2] *
            f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
            array[0] +
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[5] *
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [1] + f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data
                 .array[2] *
                 startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[8]) - local_148 / dVar63;
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
           (double)auVar58._0_8_;
      f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1] =
           (double)auVar58._8_8_;
      iVar53 = iVar52;
      if (indices->_useIndices == true) {
        iVar53 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar52];
      }
      (*adapter->_vptr_RelativeAdapterBase[8])(&startingRotation,adapter,(long)iVar53);
      if (indices->_useIndices == true) {
        iVar52 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar52];
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(&f1_19,adapter,(long)iVar52);
      auVar28._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar28._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      auVar34._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar34._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar78._8_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [2];
      auVar78._0_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [2];
      lVar50 = 0;
      auVar21._8_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [0];
      auVar21._0_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [0];
      auVar58 = vmulpd_avx512vl(auVar28,auVar21);
      dVar70 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5] *
               f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
               array[1];
      auVar22._8_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [1];
      auVar22._0_8_ =
           f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array
           [1];
      auVar58 = vfmadd132pd_avx512vl(auVar34,auVar58,auVar22);
      auVar40._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar40._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      auVar58 = vfmadd231pd_fma(auVar58,auVar78,auVar40);
      dVar74 = f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
               array[2] *
               startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
      auVar58 = vsubpd_avx(auVar58,auVar57);
      dVar11 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2] *
               f1_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
               array[0];
      pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array + 2;
      do {
        dVar87 = f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data
                 .array[lVar50];
        lVar50 = lVar50 + 1;
        ((plain_array<double,_9,_0,_0> *)(pdVar47 + -2))->array[0] = auVar58._0_8_ * dVar87;
        pdVar47[-1] = auVar58._8_8_ * dVar87;
        *pdVar47 = ((dVar11 + dVar70 + dVar74) - local_13c0) * dVar87;
        pdVar47 = pdVar47 + 3;
      } while (lVar50 != 3);
      uVar51 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols * Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows;
      uVar55 = uVar51 + 7;
      if (-1 < (long)uVar51) {
        uVar55 = uVar51;
      }
      if (7 < (long)uVar51) {
        lVar50 = 0;
        do {
          auVar59 = vaddpd_avx512f(*(undefined1 (*) [64])
                                    (startingRotation.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array + lVar50),
                                   *(undefined1 (*) [64])
                                    (Hcross.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_data + lVar50));
          *(undefined1 (*) [64])
           (Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
           + lVar50) = auVar59;
          lVar50 = lVar50 + 8;
        } while (lVar50 < (long)(uVar55 & 0xfffffffffffffff8));
      }
      auVar59 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if ((long)uVar51 % 8 != 0 && (long)(uVar55 & 0xfffffffffffffff8) <= (long)uVar51) {
        lVar50 = (long)uVar55 >> 3;
        auVar60 = vpbroadcastq_avx512f();
        uVar55 = 0;
        do {
          auVar61 = vpbroadcastq_avx512f();
          auVar61 = vporq_avx512f(auVar61,auVar59);
          uVar48 = vpcmpuq_avx512f(auVar61,auVar60,2);
          pdVar47 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array + lVar50 * 8 + uVar55;
          bVar4 = (byte)uVar48;
          auVar61._8_8_ = (ulong)((byte)(uVar48 >> 1) & 1) * (long)pdVar47[1];
          auVar61._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar47;
          auVar61._16_8_ = (ulong)((byte)(uVar48 >> 2) & 1) * (long)pdVar47[2];
          auVar61._24_8_ = (ulong)((byte)(uVar48 >> 3) & 1) * (long)pdVar47[3];
          auVar61._32_8_ = (ulong)((byte)(uVar48 >> 4) & 1) * (long)pdVar47[4];
          auVar61._40_8_ = (ulong)((byte)(uVar48 >> 5) & 1) * (long)pdVar47[5];
          auVar61._48_8_ = (ulong)((byte)(uVar48 >> 6) & 1) * (long)pdVar47[6];
          auVar61._56_8_ = (uVar48 >> 7) * (long)pdVar47[7];
          pdVar47 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + lVar50 * 8 + uVar55;
          auVar62._8_8_ = (ulong)((byte)(uVar48 >> 1) & 1) * (long)pdVar47[1];
          auVar62._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar47;
          auVar62._16_8_ = (ulong)((byte)(uVar48 >> 2) & 1) * (long)pdVar47[2];
          auVar62._24_8_ = (ulong)((byte)(uVar48 >> 3) & 1) * (long)pdVar47[3];
          auVar62._32_8_ = (ulong)((byte)(uVar48 >> 4) & 1) * (long)pdVar47[4];
          auVar62._40_8_ = (ulong)((byte)(uVar48 >> 5) & 1) * (long)pdVar47[5];
          auVar62._48_8_ = (ulong)((byte)(uVar48 >> 6) & 1) * (long)pdVar47[6];
          auVar62._56_8_ = (uVar48 >> 7) * (long)pdVar47[7];
          auVar61 = vaddpd_avx512f(auVar61,auVar62);
          pdVar47 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + lVar50 * 8 + uVar55;
          bVar5 = (bool)((byte)(uVar48 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar48 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar48 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar48 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar48 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar48 >> 6) & 1);
          *pdVar47 = (double)((ulong)(bVar4 & 1) * auVar61._0_8_ |
                             (ulong)!(bool)(bVar4 & 1) * (long)*pdVar47);
          pdVar47[1] = (double)((ulong)bVar5 * auVar61._8_8_ | (ulong)!bVar5 * (long)pdVar47[1]);
          pdVar47[2] = (double)((ulong)bVar6 * auVar61._16_8_ | (ulong)!bVar6 * (long)pdVar47[2]);
          pdVar47[3] = (double)((ulong)bVar7 * auVar61._24_8_ | (ulong)!bVar7 * (long)pdVar47[3]);
          pdVar47[4] = (double)((ulong)bVar8 * auVar61._32_8_ | (ulong)!bVar8 * (long)pdVar47[4]);
          pdVar47[5] = (double)((ulong)bVar9 * auVar61._40_8_ | (ulong)!bVar9 * (long)pdVar47[5]);
          pdVar47[6] = (double)((ulong)bVar10 * auVar61._48_8_ | (ulong)!bVar10 * (long)pdVar47[6]);
          pdVar47[7] = (double)((uVar48 >> 7) * auVar61._56_8_ |
                               (ulong)!SUB81(uVar48 >> 7,0) * (long)pdVar47[7]);
          uVar55 = uVar55 + 8;
        } while (((long)uVar51 % 8 + 7U & 0xfffffffffffffff8) != uVar55);
      }
      sVar54 = sVar54 + 1;
    } while (sVar54 != sVar3);
  }
  math::arun(&startingRotation,&Hcross);
  math::rot2cayley((cayley_t *)&f2_19,&startingRotation);
  modules::ge_main2(&xxF,&yyF,&zzF,&xyF,&yzF,&zxF,&x1P,&y1P,&z1P,&x2P,&y2P,&z2P,&m11P,&m12P,&m22P,
                    (cayley_t *)&f2_19,output);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] =
       (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[8];
  dVar63 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[1];
  dVar70 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[2];
  dVar74 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[3];
  dVar11 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[4];
  dVar87 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[5];
  dVar69 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[6];
  dVar64 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[7];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] =
       (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[0];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] = dVar63;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar70;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar74;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = dVar11;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = dVar87;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar69;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar64;
  if (Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

rotation_t ge(
    const RelativeAdapterBase & adapter,
    const Indices & indices,
    geOutput_t & output,
    bool useWeights )
{ 
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 5);

  Eigen::Matrix3d xxF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d xyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zxF = Eigen::Matrix3d::Zero();
  
  Eigen::Matrix<double,3,9> x1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> y1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> z1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> x2P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> y2P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> z2P = Eigen::Matrix<double,3,9>::Zero();
  
  Eigen::Matrix<double,9,9> m11P = Eigen::Matrix<double,9,9>::Zero();
  Eigen::Matrix<double,9,9> m12P = Eigen::Matrix<double,9,9>::Zero();
  Eigen::Matrix<double,9,9> m22P = Eigen::Matrix<double,9,9>::Zero();

  //compute the norm of all the scores
  double norm = 0.0;
  for(size_t i=0; i < numberCorrespondences; i++)
    norm += pow(adapter.getWeight(indices[i]),2);
  norm = sqrt(norm);

  //Fill summation terms
  for(size_t i=0; i < numberCorrespondences; i++)
  {
    //get the weight of this feature
    double weight = 1.0;
    if( useWeights )
      weight = adapter.getWeight(indices[i])/norm;
    
    //unrotate the bearing vectors
    bearingVector_t f1 = adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 = adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]);
    
    //compute the standard summation terms
    Eigen::Matrix3d F = f2*f2.transpose();

    xxF = xxF + weight*f1[0]*f1[0]*F;
    yyF = yyF + weight*f1[1]*f1[1]*F;
    zzF = zzF + weight*f1[2]*f1[2]*F;
    xyF = xyF + weight*f1[0]*f1[1]*F;
    yzF = yzF + weight*f1[1]*f1[2]*F;
    zxF = zxF + weight*f1[2]*f1[0]*F;
    
    //now compute the "cross"-summation terms    
    Eigen::Vector3d t1 = adapter.getCamOffset1(indices[i]);
    Eigen::Vector3d t2 = adapter.getCamOffset2(indices[i]);
    
    Eigen::Matrix<double,1,9> f2_19;
    double temp = f1[1]*t1[2]-f1[2]*t1[1];
    f2_19(0,0) = f2[0] * temp;
    f2_19(0,1) = f2[1] * temp;
    f2_19(0,2) = f2[2] * temp;
    temp = f1[2]*t1[0]-f1[0]*t1[2];
    f2_19(0,3) = f2[0] * temp;
    f2_19(0,4) = f2[1] * temp;
    f2_19(0,5) = f2[2] * temp;
    temp = f1[0]*t1[1]-f1[1]*t1[0];
    f2_19(0,6) = f2[0] * temp;
    f2_19(0,7) = f2[1] * temp;
    f2_19(0,8) = f2[2] * temp;
    
    Eigen::Matrix<double,1,9> f1_19;
    temp = f2[1]*t2[2]-f2[2]*t2[1];
    f1_19(0,0) = f1[0] * temp;
    f1_19(0,1) = f1[1] * temp;
    f1_19(0,2) = f1[2] * temp;
    temp = f2[2]*t2[0]-f2[0]*t2[2];
    f1_19(0,3) = f1[0] * temp;
    f1_19(0,4) = f1[1] * temp;
    f1_19(0,5) = f1[2] * temp;
    temp = f2[0]*t2[1]-f2[1]*t2[0];
    f1_19(0,6) = f1[0] * temp;
    f1_19(0,7) = f1[1] * temp;
    f1_19(0,8) = f1[2] * temp;
    
    if( useWeights )
    {
      x1P = x1P + ( (weight * f1[0]) * f2 ) * f1_19;
      y1P = y1P + ( (weight * f1[1]) * f2 ) * f1_19;
      z1P = z1P + ( (weight * f1[2]) * f2 ) * f1_19;
      
      x2P = x2P + ( (weight * f1[0]) * f2 ) * f2_19;
      y2P = y2P + ( (weight * f1[1]) * f2 ) * f2_19;
      z2P = z2P + ( (weight * f1[2]) * f2 ) * f2_19;
      
      m11P = m11P - ( weight * f1_19.transpose() ) * f1_19;
      m22P = m22P - ( weight * f2_19.transpose() ) * f2_19;
      m12P = m12P - ( weight * f2_19.transpose() ) * f1_19;
    }
    else
    {
      x1P = x1P + ( f1[0] * f2 ) * f1_19;
      y1P = y1P + ( f1[1] * f2 ) * f1_19;
      z1P = z1P + ( f1[2] * f2 ) * f1_19;
      
      x2P = x2P + ( f1[0]) * f2 * f2_19;
      y2P = y2P + ( f1[1]) * f2 * f2_19;
      z2P = z2P + ( f1[2]) * f2 * f2_19;
      
      m11P = m11P - f1_19.transpose() * f1_19;
      m22P = m22P - f2_19.transpose() * f2_19;
      m12P = m12P - f2_19.transpose() * f1_19;
    }
  }

  Eigen::Vector3d pointsCenter1 = Eigen::Vector3d::Zero();
  Eigen::Vector3d pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]);
    pointsCenter2 += adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f =      adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime = adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  rotation_t startingRotation = math::arun(Hcross);

  //Do minimization
  modules::ge_main2(
      xxF, yyF, zzF, xyF, yzF, zxF,
      x1P, y1P, z1P, x2P, y2P, z2P,
      m11P, m12P, m22P, math::rot2cayley(startingRotation), output);

  return output.rotation;
}